

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Box.H
# Opt level: O2

GpuArray<int,_3U> __thiscall amrex::Box::length3d(Box *this)

{
  GpuArray<int,_3U> GVar1;
  
  GVar1.arr[0] = ((this->bigend).vect[0] - (this->smallend).vect[0]) + 1;
  GVar1.arr[2] = ((this->bigend).vect[2] - (this->smallend).vect[2]) + 1;
  GVar1.arr[1] = ((this->bigend).vect[1] - (this->smallend).vect[1]) + 1;
  return (GpuArray<int,_3U>)GVar1.arr;
}

Assistant:

AMREX_GPU_HOST_DEVICE
    GpuArray<int,3> length3d () const noexcept {
#if (AMREX_SPACEDIM == 1)
        return {{bigend[0]-smallend[0]+1, 1, 1}};
#elif (AMREX_SPACEDIM == 2)
        return {{bigend[0]-smallend[0]+1, bigend[1]-smallend[1]+1, 1}};
#elif (AMREX_SPACEDIM == 3)
        return {{bigend[0]-smallend[0]+1, bigend[1]-smallend[1]+1, bigend[2]-smallend[2]+1}};
#endif
    }